

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void ot::commissioner::CommissionerApp::MergeDataset(BbrDataset *aDst,BbrDataset *aSrc)

{
  BbrDataset *aSrc_local;
  BbrDataset *aDst_local;
  
  if ((aSrc->mPresentFlags & 0x8000) != 0) {
    std::__cxx11::string::operator=((string *)aDst,(string *)aSrc);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x8000;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    std::__cxx11::string::operator=
              ((string *)&aDst->mRegistrarHostname,(string *)&aSrc->mRegistrarHostname);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x4000;
  }
  if ((aSrc->mPresentFlags & 0x2000) != 0) {
    std::__cxx11::string::operator=
              ((string *)&aDst->mRegistrarIpv6Addr,(string *)&aSrc->mRegistrarIpv6Addr);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x2000;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(BbrDataset &aDst, const BbrDataset &aSrc)
{
#define SET_IF_PRESENT(name)                            \
    if (aSrc.mPresentFlags & BbrDataset::k##name##Bit)  \
    {                                                   \
        aDst.m##name = aSrc.m##name;                    \
        aDst.mPresentFlags |= BbrDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(TriHostname);
    SET_IF_PRESENT(RegistrarHostname);
    SET_IF_PRESENT(RegistrarIpv6Addr);

#undef SET_IF_PRESENT
}